

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int ARKodeResStolerance(void *arkode_mem,sunrealtype rabstol)

{
  int iVar1;
  ARKodeMem in_RDI;
  ARKodeMem in_XMM0_Qa;
  ARKodeMem ark_mem;
  N_Vector *in_stack_ffffffffffffffd8;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x1a5,"ARKodeResStolerance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_massmatrix == 0) {
    arkProcessError(in_RDI,-0x30,0x1ae,"ARKodeResStolerance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"time-stepping module does not support non-identity mass matrices");
    local_4 = -0x30;
  }
  else if (in_RDI->MallocDone == 0) {
    arkProcessError(in_RDI,-0x17,0x1b6,"ARKodeResStolerance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"Attempt to call before ARKodeInit.");
    local_4 = -0x17;
  }
  else if (0.0 <= (double)in_XMM0_Qa) {
    in_RDI->Ratolmin0 = (uint)((double)in_XMM0_Qa == 0.0);
    if (in_RDI->rwt_is_ewt != 0) {
      in_RDI->rwt = (N_Vector)0x0;
      iVar1 = arkAllocVec(in_XMM0_Qa,(N_Vector)in_RDI,in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        arkProcessError(in_RDI,-0x14,0x1ca,"ARKodeResStolerance",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Allocation of arkode_mem failed.");
        return -0x16;
      }
      in_RDI->rwt_is_ewt = 0;
    }
    in_RDI->SRabstol = (sunrealtype)in_XMM0_Qa;
    in_RDI->ritol = 0;
    in_RDI->user_efun = 0;
    in_RDI->rfun = arkRwtSet;
    in_RDI->r_data = in_RDI;
    local_4 = 0;
  }
  else {
    arkProcessError(in_RDI,-0x16,0x1bc,"ARKodeResStolerance",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"rabstol has negative component(s) (illegal).");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int ARKodeResStolerance(void* arkode_mem, sunrealtype rabstol)
{
  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Check inputs */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }
  if (rabstol < ZERO)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_BAD_RABSTOL);
    return (ARK_ILL_INPUT);
  }

  /* Set flag indicating whether rabstol == 0 */
  ark_mem->Ratolmin0 = (rabstol == ZERO);

  /* Allocate space for rwt if necessary */
  if (ark_mem->rwt_is_ewt)
  {
    ark_mem->rwt = NULL;
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->rwt)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->rwt_is_ewt = SUNFALSE;
  }

  /* Copy tolerances into memory */
  ark_mem->SRabstol = rabstol;
  ark_mem->ritol    = ARK_SS;

  /* enforce use of arkRwtSet */
  ark_mem->user_efun = SUNFALSE;
  ark_mem->rfun      = arkRwtSet;
  ark_mem->r_data    = ark_mem;

  return (ARK_SUCCESS);
}